

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O2

int boost::report_errors(void)

{
  report_errors_reminder *prVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  
  prVar1 = detail::report_errors_remind();
  prVar1->called_report_errors_function = true;
  detail::report_errors_remind();
  iVar3 = detail::test_errors()::x;
  if (detail::test_errors()::x == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No errors detected.");
    iVar3 = 0;
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,detail::test_errors()::x);
    poVar2 = std::operator<<(poVar2," error");
    pcVar4 = "s";
    if (iVar3 == 1) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2," detected.");
    iVar3 = 1;
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return iVar3;
}

Assistant:

inline int report_errors()
{
    boost::detail::report_errors_remind().called_report_errors_function = true;

    int errors = boost::detail::test_errors();

    if( errors == 0 )
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
          << "No errors detected." << std::endl;
        return 0;
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
          << errors << " error" << (errors == 1? "": "s") << " detected." << std::endl;
        return 1;
    }
}